

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pSVar1;
  TValue *fi_00;
  TValue *io2;
  TValue *io1;
  TValue *fi;
  GCObject *owner;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  owner = (GCObject *)0x0;
  fi = (TValue *)0x0;
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi_00 = index2value(L,funcindex);
  val = (TValue *)aux_upvalue(fi_00,(int)name,(TValue **)&owner,(GCObject **)&fi);
  if (val != (TValue *)0x0) {
    (_n_local->top).p = (StkId)((_n_local->top).offset + -0x10);
    pSVar1 = (_n_local->top).p;
    owner->next = (GCObject *)(pSVar1->val).value_;
    owner->tt = (pSVar1->val).tt_;
    if ((((owner->tt & 0x40) != 0) && ((fi->field_0x9 & 0x20) != 0)) &&
       ((owner->next->marked & 0x18) != 0)) {
      luaC_barrier_(_n_local,(GCObject *)fi,owner->next);
    }
  }
  return (char *)val;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val = NULL;  /* to avoid warnings */
  GCObject *owner = NULL;  /* to avoid warnings */
  TValue *fi;
  lua_lock(L);
  fi = index2value(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val, &owner);
  if (name) {
    L->top.p--;
    setobj(L, val, s2v(L->top.p));
    luaC_barrier(L, owner, val);
  }
  lua_unlock(L);
  return name;
}